

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

void __thiscall
Protocol::MQTT::V5::ControlPacket<(Protocol::MQTT::Common::ControlPacketType)3,_true>::ControlPacket
          (ControlPacket<(Protocol::MQTT::Common::ControlPacketType)3,_true> *this)

{
  (this->super_ControlPacketSerializableImpl).header = &(this->header).super_FixedHeaderBase;
  (this->super_ControlPacketSerializableImpl).remLength.super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_getSize_00124d58;
  (this->super_ControlPacketSerializableImpl).remLength.size = 1;
  (this->super_ControlPacketSerializableImpl).remLength.field_0.value[0] = '\0';
  (this->super_ControlPacketSerializableImpl).fixedVariableHeader =
       &(this->fixedVariableHeader).super_FixedFieldGeneric;
  (this->super_ControlPacketSerializableImpl).props = &(this->props).super_SerializableProperties;
  (this->super_ControlPacketSerializableImpl).payload = &(this->payload).super_SerializablePayload;
  (this->super_ControlPacketSerializableImpl).super_ControlPacketSerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_00125dd0;
  (this->header).super_FixedHeaderBase.typeAndFlags = '0';
  (this->header).super_FixedHeaderBase._vptr_FixedHeaderBase = (_func_int **)&PTR_getType_00125e28;
  (this->fixedVariableHeader).super_TopicAndID.topicName.super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_getSize_001253d8;
  (this->fixedVariableHeader).super_TopicAndID.topicName.length = 0;
  (this->fixedVariableHeader).super_TopicAndID.topicName.data = (char *)0x0;
  (this->fixedVariableHeader).super_FixedFieldGeneric.value =
       &(this->fixedVariableHeader)._v.super_GenericTypeBase;
  (this->fixedVariableHeader).super_FixedFieldGeneric.super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_getSize_00125e70;
  (this->fixedVariableHeader)._v.super_GenericTypeBase._vptr_GenericTypeBase =
       (_func_int **)&PTR_typeSize_00125f00;
  (this->fixedVariableHeader)._v.value = &(this->fixedVariableHeader).super_TopicAndID;
  (this->props).super_SerializableProperties.super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_getSize_00125d78;
  (this->props).length.super_Serializable._vptr_Serializable = (_func_int **)&PTR_getSize_00124d58;
  (this->props).length.size = 1;
  (this->props).length.field_0.value[0] = '\0';
  (this->props).buffer = (uint8 *)0x0;
  (this->payload).super_SerializablePayload.super_EmptySerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_00125f40;
  (this->payload).data = (uint8 *)0x0;
  (this->payload).size = 0;
  (this->fixedVariableHeader).flags = &(this->header).super_FixedHeaderBase.typeAndFlags;
  return;
}

Assistant:

ControlPacket() : ControlPacketSerializableImpl(header, fixedVariableHeader, props, payload)
                {
                    payload.setFlags(fixedVariableHeader); fixedVariableHeader.setFlags(header.typeAndFlags);
                }